

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

TableSet * __thiscall
wasm::Builder::makeTableSet(Builder *this,Name table,Expression *index,Expression *value)

{
  TableSet *pTVar1;
  TableSet *ret;
  Expression *value_local;
  Expression *index_local;
  Builder *this_local;
  Name table_local;
  
  table_local.super_IString.str._M_len = table.super_IString.str._M_str;
  this_local = table.super_IString.str._M_len;
  pTVar1 = MixedArena::alloc<wasm::TableSet>(&this->wasm->allocator);
  Name::operator=(&pTVar1->table,(Name *)&this_local);
  pTVar1->index = index;
  pTVar1->value = value;
  ::wasm::TableSet::finalize();
  return pTVar1;
}

Assistant:

TableSet* makeTableSet(Name table, Expression* index, Expression* value) {
    auto* ret = wasm.allocator.alloc<TableSet>();
    ret->table = table;
    ret->index = index;
    ret->value = value;
    ret->finalize();
    return ret;
  }